

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_io.c
# Opt level: O0

tnt_error tnt_io_connect(tnt_stream_net *s)

{
  char *local_148;
  char local_138 [8];
  char service [128];
  char *port;
  char host [128];
  uri *uri;
  tnt_error result;
  tnt_stream_net *s_local;
  
  host._120_8_ = (s->opt).uri;
  if ((uint)((uri *)host._120_8_)->host_hint < 3) {
    if (((uri *)host._120_8_)->service == (char *)0x0) {
      local_148 = "3301";
    }
    else {
      local_148 = ((uri *)host._120_8_)->service;
    }
    memcpy(&port,((uri *)host._120_8_)->host,((uri *)host._120_8_)->host_len);
    host[*(long *)(host._120_8_ + 0x38) + -8] = '\0';
    uri._4_4_ = tnt_io_connect_tcp(s,(char *)&port,local_148);
  }
  else if (((uri *)host._120_8_)->host_hint == 3) {
    memcpy(local_138,((uri *)host._120_8_)->service,((uri *)host._120_8_)->service_len);
    local_138[*(long *)(host._120_8_ + 0x48)] = '\0';
    uri._4_4_ = tnt_io_connect_unix(s,local_138);
  }
  else {
    uri._4_4_ = TNT_EFAIL;
  }
  if (uri._4_4_ == TNT_EOK) {
    s->connected = 1;
    s_local._4_4_ = TNT_EOK;
  }
  else {
    s_local._4_4_ = uri._4_4_;
  }
  return s_local._4_4_;
}

Assistant:

enum tnt_error
tnt_io_connect(struct tnt_stream_net *s)
{
	enum tnt_error result;
	struct uri *uri = s->opt.uri;
	switch (uri->host_hint) {
	case URI_NAME:
	case URI_IPV4:
	case URI_IPV6: {
		char host[128];
		const char *port = uri->service == NULL ? "3301" :
			uri->service;
		memcpy(host, uri->host, uri->host_len);
		host[uri->host_len] = '\0';
		result = tnt_io_connect_tcp(s, host, port);
		break;
	}
	case URI_UNIX: {
		char service[128];
		memcpy(service, uri->service, uri->service_len);
		service[uri->service_len] = '\0';
		result = tnt_io_connect_unix(s, service);
		break;
	}
	default:
		result = TNT_EFAIL;
	}
	if (result != TNT_EOK)
		return result;
	s->connected = 1;
	return TNT_EOK;
}